

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_delay.cc
# Opt level: O0

void __thiscall
sptk::InputSourceDelay::InputSourceDelay
          (InputSourceDelay *this,int delay,bool keep_sequence_length,InputSourceInterface *source)

{
  int iVar1;
  _Elt_pointer pvVar2;
  byte bVar3;
  byte bVar4;
  _Elt_pointer in_RCX;
  byte in_DL;
  int in_ESI;
  queue<std::vector<double,_std::allocator<double>_>,_std::deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  *in_RDI;
  vector<double,_std::allocator<double>_> data;
  undefined5 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  InputSourceInterface::InputSourceInterface((InputSourceInterface *)in_RDI);
  (in_RDI->c).
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__InputSourceDelay_00128c10;
  *(int *)&(in_RDI->c).
           super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size = in_ESI;
  *(byte *)((long)&(in_RDI->c).
                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 4) = in_DL & 1;
  (in_RDI->c).
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = in_RCX;
  *(undefined1 *)
   &(in_RDI->c).
    super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = 1;
  std::
  queue<std::vector<double,std::allocator<double>>,std::deque<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
  ::
  queue<std::deque<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,void>
            (in_RDI);
  if (((in_RDI->c).
       super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur == (_Elt_pointer)0x0) ||
     (bVar3 = (*(code *)(((in_RDI->c).
                          super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[3])(), (bVar3 & 1) == 0)) {
    *(undefined1 *)
     &(in_RDI->c).
      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x106462);
    if ((int)(in_RDI->c).
             super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size < 1) {
      *(undefined4 *)
       &in_RDI[1].c.
        super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = 0;
      while ((iVar1 = *(int *)&in_RDI[1].c.
                               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last,
             SBORROW4(iVar1,-in_ESI) != iVar1 + in_ESI < 0 &&
             (pvVar2 = (in_RDI->c).
                       super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur,
             bVar3 = (*(code *)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[4])
                               (pvVar2,&stack0xffffffffffffffc0), (bVar3 & 1) != 0))) {
        *(int *)&in_RDI[1].c.
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last =
             *(int *)&in_RDI[1].c.
                      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last + 1;
      }
    }
    else {
      *(undefined4 *)
       &in_RDI[1].c.
        super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = 0;
      while ((*(int *)&in_RDI[1].c.
                       super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last <
              (int)(in_RDI->c).
                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size &&
             (pvVar2 = (in_RDI->c).
                       super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur,
             bVar4 = (*(code *)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[4])
                               (pvVar2,&stack0xffffffffffffffc0), (bVar4 & 1) != 0))) {
        std::
        queue<std::vector<double,_std::allocator<double>_>,_std::deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::push(in_RDI,(value_type *)
                      CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffffae,
                                              CONCAT15(bVar4,in_stack_ffffffffffffffa8))));
        *(int *)&in_RDI[1].c.
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last =
             *(int *)&in_RDI[1].c.
                      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last + 1;
      }
      if (((in_RDI->c).
           super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size & 0x100000000) == 0) {
        *(int *)&in_RDI[1].c.
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last =
             (int)(in_RDI->c).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

InputSourceDelay::InputSourceDelay(int delay, bool keep_sequence_length,
                                   InputSourceInterface* source)
    : delay_(delay),
      keep_sequence_length_(keep_sequence_length),
      source_(source),
      is_valid_(true) {
  if (NULL == source_ || !source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  std::vector<double> data;
  if (delay_ <= 0) {
    // Skip data.
    for (num_zeros_ = 0; num_zeros_ < -delay; ++num_zeros_) {
      if (!source_->Get(&data)) {
        break;
      }
    }
  } else {
    // Store data.
    for (num_zeros_ = 0; num_zeros_ < delay_; ++num_zeros_) {
      if (!source_->Get(&data)) {
        break;
      }
      queue_.push(data);
    }
    if (!keep_sequence_length_) {
      num_zeros_ = delay_;
    }
  }
}